

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

void andres::marray_detail::
     operate<andres::marray_detail::DividedByEqual<float,float>,float,float,true,std::allocator<unsigned_long>>
               (View<float,_false,_std::allocator<unsigned_long>_> *v,size_t w)

{
  CoordinateOrder CVar1;
  ulong uVar2;
  View<float,_true,_std::allocator<unsigned_long>_> *pVVar3;
  bool bVar4;
  size_t sVar5;
  size_t sVar6;
  reference pfVar7;
  reference pfVar8;
  reference pfVar9;
  CoordinateOrder *pCVar10;
  reference y;
  bool local_16a;
  bool local_169;
  undefined1 local_168 [8];
  const_iterator itW;
  iterator itV;
  ulong local_f8;
  size_t j_2;
  float *dataW;
  float *dataV_1;
  undefined1 local_d8 [8];
  Marray<float,_std::allocator<unsigned_long>_> m;
  undefined1 local_80 [8];
  iterator it;
  ulong local_40;
  size_t j_1;
  float *dataV;
  ulong uStack_28;
  float x;
  size_t j;
  View<float,_true,_std::allocator<unsigned_long>_> *w_local;
  View<float,_false,_std::allocator<unsigned_long>_> *v_local;
  
  j = w;
  w_local = (View<float,_true,_std::allocator<unsigned_long>_> *)v;
  sVar5 = View<float,_false,_std::allocator<unsigned_long>_>::size(v);
  local_169 = false;
  if (sVar5 != 0) {
    sVar5 = View<float,_true,_std::allocator<unsigned_long>_>::size
                      ((View<float,_true,_std::allocator<unsigned_long>_> *)j);
    local_169 = sVar5 != 0;
  }
  Assert<bool>(local_169);
  sVar5 = View<float,_true,_std::allocator<unsigned_long>_>::dimension
                    ((View<float,_true,_std::allocator<unsigned_long>_> *)j);
  local_16a = true;
  if (sVar5 != 0) {
    sVar5 = View<float,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<float,_false,_std::allocator<unsigned_long>_> *)w_local);
    sVar6 = View<float,_true,_std::allocator<unsigned_long>_>::dimension
                      ((View<float,_true,_std::allocator<unsigned_long>_> *)j);
    local_16a = sVar5 == sVar6;
  }
  Assert<bool>(local_16a);
  sVar5 = View<float,_true,_std::allocator<unsigned_long>_>::dimension
                    ((View<float,_true,_std::allocator<unsigned_long>_> *)j);
  if (sVar5 != 0) {
    for (uStack_28 = 0; uVar2 = uStack_28,
        sVar5 = View<float,_false,_std::allocator<unsigned_long>_>::dimension
                          ((View<float,_false,_std::allocator<unsigned_long>_> *)w_local),
        uVar2 < sVar5; uStack_28 = uStack_28 + 1) {
      sVar5 = View<float,_false,_std::allocator<unsigned_long>_>::shape
                        ((View<float,_false,_std::allocator<unsigned_long>_> *)w_local,uStack_28);
      sVar6 = View<float,_true,_std::allocator<unsigned_long>_>::shape
                        ((View<float,_true,_std::allocator<unsigned_long>_> *)j,uStack_28);
      Assert<bool>(sVar5 == sVar6);
    }
  }
  sVar5 = View<float,_true,_std::allocator<unsigned_long>_>::dimension
                    ((View<float,_true,_std::allocator<unsigned_long>_> *)j);
  if (sVar5 == 0) {
    pfVar7 = View<float,true,std::allocator<unsigned_long>>::operator()
                       ((View<float,true,std::allocator<unsigned_long>> *)j,0);
    dataV._4_4_ = *pfVar7;
    bVar4 = View<float,_false,_std::allocator<unsigned_long>_>::isSimple
                      ((View<float,_false,_std::allocator<unsigned_long>_> *)w_local);
    if (bVar4) {
      pfVar8 = View<float,false,std::allocator<unsigned_long>>::operator()
                         ((View<float,false,std::allocator<unsigned_long>> *)w_local,0);
      for (local_40 = 0;
          sVar5 = View<float,_false,_std::allocator<unsigned_long>_>::size
                            ((View<float,_false,_std::allocator<unsigned_long>_> *)w_local),
          local_40 < sVar5; local_40 = local_40 + 1) {
        DividedByEqual<float,_float>::operator()
                  ((DividedByEqual<float,_float> *)((long)&v_local + 7),pfVar8 + local_40,
                   (float *)((long)&dataV + 4));
      }
    }
    else {
      sVar5 = View<float,_false,_std::allocator<unsigned_long>_>::dimension
                        ((View<float,_false,_std::allocator<unsigned_long>_> *)w_local);
      pVVar3 = w_local;
      if (sVar5 == 1) {
        pfVar8 = View<float,false,std::allocator<unsigned_long>>::operator()
                           ((View<float,false,std::allocator<unsigned_long>> *)w_local,0);
        OperateHelperBinaryScalar<(unsigned_short)1,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_std::allocator<unsigned_long>_>
        ::operate(pVVar3,(long)&dataV + 4,pfVar8);
      }
      else {
        sVar5 = View<float,_false,_std::allocator<unsigned_long>_>::dimension
                          ((View<float,_false,_std::allocator<unsigned_long>_> *)w_local);
        pVVar3 = w_local;
        if (sVar5 == 2) {
          pfVar8 = View<float,false,std::allocator<unsigned_long>>::operator()
                             ((View<float,false,std::allocator<unsigned_long>> *)w_local,0);
          OperateHelperBinaryScalar<(unsigned_short)2,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_std::allocator<unsigned_long>_>
          ::operate(pVVar3,(long)&dataV + 4,pfVar8);
        }
        else {
          sVar5 = View<float,_false,_std::allocator<unsigned_long>_>::dimension
                            ((View<float,_false,_std::allocator<unsigned_long>_> *)w_local);
          pVVar3 = w_local;
          if (sVar5 == 3) {
            pfVar8 = View<float,false,std::allocator<unsigned_long>>::operator()
                               ((View<float,false,std::allocator<unsigned_long>> *)w_local,0);
            OperateHelperBinaryScalar<(unsigned_short)3,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_std::allocator<unsigned_long>_>
            ::operate(pVVar3,(long)&dataV + 4,pfVar8);
          }
          else {
            sVar5 = View<float,_false,_std::allocator<unsigned_long>_>::dimension
                              ((View<float,_false,_std::allocator<unsigned_long>_> *)w_local);
            pVVar3 = w_local;
            if (sVar5 == 4) {
              pfVar8 = View<float,false,std::allocator<unsigned_long>>::operator()
                                 ((View<float,false,std::allocator<unsigned_long>> *)w_local,0);
              OperateHelperBinaryScalar<(unsigned_short)4,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_std::allocator<unsigned_long>_>
              ::operate(pVVar3,(long)&dataV + 4,pfVar8);
            }
            else {
              sVar5 = View<float,_false,_std::allocator<unsigned_long>_>::dimension
                                ((View<float,_false,_std::allocator<unsigned_long>_> *)w_local);
              pVVar3 = w_local;
              if (sVar5 == 5) {
                pfVar8 = View<float,false,std::allocator<unsigned_long>>::operator()
                                   ((View<float,false,std::allocator<unsigned_long>> *)w_local,0);
                OperateHelperBinaryScalar<(unsigned_short)5,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_std::allocator<unsigned_long>_>
                ::operate(pVVar3,(long)&dataV + 4,pfVar8);
              }
              else {
                sVar5 = View<float,_false,_std::allocator<unsigned_long>_>::dimension
                                  ((View<float,_false,_std::allocator<unsigned_long>_> *)w_local);
                pVVar3 = w_local;
                if (sVar5 == 6) {
                  pfVar8 = View<float,false,std::allocator<unsigned_long>>::operator()
                                     ((View<float,false,std::allocator<unsigned_long>> *)w_local,0);
                  OperateHelperBinaryScalar<(unsigned_short)6,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_std::allocator<unsigned_long>_>
                  ::operate(pVVar3,(long)&dataV + 4,pfVar8);
                }
                else {
                  sVar5 = View<float,_false,_std::allocator<unsigned_long>_>::dimension
                                    ((View<float,_false,_std::allocator<unsigned_long>_> *)w_local);
                  pVVar3 = w_local;
                  if (sVar5 == 7) {
                    pfVar8 = View<float,false,std::allocator<unsigned_long>>::operator()
                                       ((View<float,false,std::allocator<unsigned_long>> *)w_local,0
                                       );
                    OperateHelperBinaryScalar<(unsigned_short)7,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_std::allocator<unsigned_long>_>
                    ::operate(pVVar3,(long)&dataV + 4,pfVar8);
                  }
                  else {
                    sVar5 = View<float,_false,_std::allocator<unsigned_long>_>::dimension
                                      ((View<float,_false,_std::allocator<unsigned_long>_> *)w_local
                                      );
                    pVVar3 = w_local;
                    if (sVar5 == 8) {
                      pfVar8 = View<float,false,std::allocator<unsigned_long>>::operator()
                                         ((View<float,false,std::allocator<unsigned_long>> *)w_local
                                          ,0);
                      OperateHelperBinaryScalar<(unsigned_short)8,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_std::allocator<unsigned_long>_>
                      ::operate(pVVar3,(long)&dataV + 4,pfVar8);
                    }
                    else {
                      sVar5 = View<float,_false,_std::allocator<unsigned_long>_>::dimension
                                        ((View<float,_false,_std::allocator<unsigned_long>_> *)
                                         w_local);
                      pVVar3 = w_local;
                      if (sVar5 == 9) {
                        pfVar8 = View<float,false,std::allocator<unsigned_long>>::operator()
                                           ((View<float,false,std::allocator<unsigned_long>> *)
                                            w_local,0);
                        OperateHelperBinaryScalar<(unsigned_short)9,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_std::allocator<unsigned_long>_>
                        ::operate(pVVar3,(long)&dataV + 4,pfVar8);
                      }
                      else {
                        sVar5 = View<float,_false,_std::allocator<unsigned_long>_>::dimension
                                          ((View<float,_false,_std::allocator<unsigned_long>_> *)
                                           w_local);
                        pVVar3 = w_local;
                        if (sVar5 == 10) {
                          pfVar8 = View<float,false,std::allocator<unsigned_long>>::operator()
                                             ((View<float,false,std::allocator<unsigned_long>> *)
                                              w_local,0);
                          OperateHelperBinaryScalar<(unsigned_short)10,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_std::allocator<unsigned_long>_>
                          ::operate(pVVar3,(long)&dataV + 4,pfVar8);
                        }
                        else {
                          View<float,_false,_std::allocator<unsigned_long>_>::begin
                                    ((iterator *)local_80,
                                     (View<float,_false,_std::allocator<unsigned_long>_> *)w_local);
                          while (bVar4 = Iterator<float,_false,_std::allocator<unsigned_long>_>::
                                         hasMore((Iterator<float,_false,_std::allocator<unsigned_long>_>
                                                  *)local_80), bVar4) {
                            pfVar9 = Iterator<float,_false,_std::allocator<unsigned_long>_>::
                                     operator*((Iterator<float,_false,_std::allocator<unsigned_long>_>
                                                *)local_80);
                            DividedByEqual<float,_float>::operator()
                                      ((DividedByEqual<float,_float> *)((long)&v_local + 7),pfVar9,
                                       (float *)((long)&dataV + 4));
                            Iterator<float,_false,_std::allocator<unsigned_long>_>::operator++
                                      ((Iterator<float,_false,_std::allocator<unsigned_long>_> *)
                                       local_80);
                          }
                          Iterator<float,_false,_std::allocator<unsigned_long>_>::~Iterator
                                    ((Iterator<float,_false,_std::allocator<unsigned_long>_> *)
                                     local_80);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    bVar4 = View<float,false,std::allocator<unsigned_long>>::
            overlaps<float,true,std::allocator<unsigned_long>>
                      ((View<float,false,std::allocator<unsigned_long>> *)w_local,
                       (View<float,_true,_std::allocator<unsigned_long>_> *)j);
    if (bVar4) {
      Marray<float,std::allocator<unsigned_long>>::Marray<float,true,std::allocator<unsigned_long>>
                ((Marray<float,std::allocator<unsigned_long>> *)local_d8,
                 (View<float,_true,_std::allocator<unsigned_long>_> *)j);
      operate<andres::marray_detail::DividedByEqual<float,float>,float,float,false,std::allocator<unsigned_long>>
                (w_local,(Marray<float,std::allocator<unsigned_long>> *)local_d8);
      Marray<float,_std::allocator<unsigned_long>_>::~Marray
                ((Marray<float,_std::allocator<unsigned_long>_> *)local_d8);
    }
    else {
      pCVar10 = View<float,_false,_std::allocator<unsigned_long>_>::coordinateOrder
                          ((View<float,_false,_std::allocator<unsigned_long>_> *)w_local);
      CVar1 = *pCVar10;
      pCVar10 = View<float,_true,_std::allocator<unsigned_long>_>::coordinateOrder
                          ((View<float,_true,_std::allocator<unsigned_long>_> *)j);
      if (((CVar1 == *pCVar10) &&
          (bVar4 = View<float,_false,_std::allocator<unsigned_long>_>::isSimple
                             ((View<float,_false,_std::allocator<unsigned_long>_> *)w_local), bVar4)
          ) && (bVar4 = View<float,_true,_std::allocator<unsigned_long>_>::isSimple
                                  ((View<float,_true,_std::allocator<unsigned_long>_> *)j), bVar4))
      {
        pfVar8 = View<float,false,std::allocator<unsigned_long>>::operator()
                           ((View<float,false,std::allocator<unsigned_long>> *)w_local,0);
        pfVar7 = View<float,true,std::allocator<unsigned_long>>::operator()
                           ((View<float,true,std::allocator<unsigned_long>> *)j,0);
        for (local_f8 = 0;
            sVar5 = View<float,_false,_std::allocator<unsigned_long>_>::size
                              ((View<float,_false,_std::allocator<unsigned_long>_> *)w_local),
            local_f8 < sVar5; local_f8 = local_f8 + 1) {
          DividedByEqual<float,_float>::operator()
                    ((DividedByEqual<float,_float> *)((long)&v_local + 7),pfVar8 + local_f8,
                     pfVar7 + local_f8);
        }
      }
      else {
        sVar6 = View<float,_false,_std::allocator<unsigned_long>_>::dimension
                          ((View<float,_false,_std::allocator<unsigned_long>_> *)w_local);
        pVVar3 = w_local;
        sVar5 = j;
        if (sVar6 == 1) {
          pfVar8 = View<float,false,std::allocator<unsigned_long>>::operator()
                             ((View<float,false,std::allocator<unsigned_long>> *)w_local,0);
          pfVar7 = View<float,true,std::allocator<unsigned_long>>::operator()
                             ((View<float,true,std::allocator<unsigned_long>> *)j,0);
          OperateHelperBinary<(unsigned_short)1,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
          ::operate(pVVar3,sVar5,pfVar8,pfVar7);
        }
        else {
          sVar6 = View<float,_false,_std::allocator<unsigned_long>_>::dimension
                            ((View<float,_false,_std::allocator<unsigned_long>_> *)w_local);
          pVVar3 = w_local;
          sVar5 = j;
          if (sVar6 == 2) {
            pfVar8 = View<float,false,std::allocator<unsigned_long>>::operator()
                               ((View<float,false,std::allocator<unsigned_long>> *)w_local,0);
            pfVar7 = View<float,true,std::allocator<unsigned_long>>::operator()
                               ((View<float,true,std::allocator<unsigned_long>> *)j,0);
            OperateHelperBinary<(unsigned_short)2,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
            ::operate(pVVar3,sVar5,pfVar8,pfVar7);
          }
          else {
            sVar6 = View<float,_false,_std::allocator<unsigned_long>_>::dimension
                              ((View<float,_false,_std::allocator<unsigned_long>_> *)w_local);
            pVVar3 = w_local;
            sVar5 = j;
            if (sVar6 == 3) {
              pfVar8 = View<float,false,std::allocator<unsigned_long>>::operator()
                                 ((View<float,false,std::allocator<unsigned_long>> *)w_local,0);
              pfVar7 = View<float,true,std::allocator<unsigned_long>>::operator()
                                 ((View<float,true,std::allocator<unsigned_long>> *)j,0);
              OperateHelperBinary<(unsigned_short)3,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
              ::operate(pVVar3,sVar5,pfVar8,pfVar7);
            }
            else {
              sVar6 = View<float,_false,_std::allocator<unsigned_long>_>::dimension
                                ((View<float,_false,_std::allocator<unsigned_long>_> *)w_local);
              pVVar3 = w_local;
              sVar5 = j;
              if (sVar6 == 4) {
                pfVar8 = View<float,false,std::allocator<unsigned_long>>::operator()
                                   ((View<float,false,std::allocator<unsigned_long>> *)w_local,0);
                pfVar7 = View<float,true,std::allocator<unsigned_long>>::operator()
                                   ((View<float,true,std::allocator<unsigned_long>> *)j,0);
                OperateHelperBinary<(unsigned_short)4,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                ::operate(pVVar3,sVar5,pfVar8,pfVar7);
              }
              else {
                sVar6 = View<float,_false,_std::allocator<unsigned_long>_>::dimension
                                  ((View<float,_false,_std::allocator<unsigned_long>_> *)w_local);
                pVVar3 = w_local;
                sVar5 = j;
                if (sVar6 == 5) {
                  pfVar8 = View<float,false,std::allocator<unsigned_long>>::operator()
                                     ((View<float,false,std::allocator<unsigned_long>> *)w_local,0);
                  pfVar7 = View<float,true,std::allocator<unsigned_long>>::operator()
                                     ((View<float,true,std::allocator<unsigned_long>> *)j,0);
                  OperateHelperBinary<(unsigned_short)5,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                  ::operate(pVVar3,sVar5,pfVar8,pfVar7);
                }
                else {
                  sVar6 = View<float,_false,_std::allocator<unsigned_long>_>::dimension
                                    ((View<float,_false,_std::allocator<unsigned_long>_> *)w_local);
                  pVVar3 = w_local;
                  sVar5 = j;
                  if (sVar6 == 6) {
                    pfVar8 = View<float,false,std::allocator<unsigned_long>>::operator()
                                       ((View<float,false,std::allocator<unsigned_long>> *)w_local,0
                                       );
                    pfVar7 = View<float,true,std::allocator<unsigned_long>>::operator()
                                       ((View<float,true,std::allocator<unsigned_long>> *)j,0);
                    OperateHelperBinary<(unsigned_short)6,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                    ::operate(pVVar3,sVar5,pfVar8,pfVar7);
                  }
                  else {
                    sVar6 = View<float,_false,_std::allocator<unsigned_long>_>::dimension
                                      ((View<float,_false,_std::allocator<unsigned_long>_> *)w_local
                                      );
                    pVVar3 = w_local;
                    sVar5 = j;
                    if (sVar6 == 7) {
                      pfVar8 = View<float,false,std::allocator<unsigned_long>>::operator()
                                         ((View<float,false,std::allocator<unsigned_long>> *)w_local
                                          ,0);
                      pfVar7 = View<float,true,std::allocator<unsigned_long>>::operator()
                                         ((View<float,true,std::allocator<unsigned_long>> *)j,0);
                      OperateHelperBinary<(unsigned_short)7,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                      ::operate(pVVar3,sVar5,pfVar8,pfVar7);
                    }
                    else {
                      sVar6 = View<float,_false,_std::allocator<unsigned_long>_>::dimension
                                        ((View<float,_false,_std::allocator<unsigned_long>_> *)
                                         w_local);
                      pVVar3 = w_local;
                      sVar5 = j;
                      if (sVar6 == 8) {
                        pfVar8 = View<float,false,std::allocator<unsigned_long>>::operator()
                                           ((View<float,false,std::allocator<unsigned_long>> *)
                                            w_local,0);
                        pfVar7 = View<float,true,std::allocator<unsigned_long>>::operator()
                                           ((View<float,true,std::allocator<unsigned_long>> *)j,0);
                        OperateHelperBinary<(unsigned_short)8,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                        ::operate(pVVar3,sVar5,pfVar8,pfVar7);
                      }
                      else {
                        sVar6 = View<float,_false,_std::allocator<unsigned_long>_>::dimension
                                          ((View<float,_false,_std::allocator<unsigned_long>_> *)
                                           w_local);
                        pVVar3 = w_local;
                        sVar5 = j;
                        if (sVar6 == 9) {
                          pfVar8 = View<float,false,std::allocator<unsigned_long>>::operator()
                                             ((View<float,false,std::allocator<unsigned_long>> *)
                                              w_local,0);
                          pfVar7 = View<float,true,std::allocator<unsigned_long>>::operator()
                                             ((View<float,true,std::allocator<unsigned_long>> *)j,0)
                          ;
                          OperateHelperBinary<(unsigned_short)9,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                          ::operate(pVVar3,sVar5,pfVar8,pfVar7);
                        }
                        else {
                          sVar6 = View<float,_false,_std::allocator<unsigned_long>_>::dimension
                                            ((View<float,_false,_std::allocator<unsigned_long>_> *)
                                             w_local);
                          pVVar3 = w_local;
                          sVar5 = j;
                          if (sVar6 == 10) {
                            pfVar8 = View<float,false,std::allocator<unsigned_long>>::operator()
                                               ((View<float,false,std::allocator<unsigned_long>> *)
                                                w_local,0);
                            pfVar7 = View<float,true,std::allocator<unsigned_long>>::operator()
                                               ((View<float,true,std::allocator<unsigned_long>> *)j,
                                                0);
                            OperateHelperBinary<(unsigned_short)10,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                            ::operate(pVVar3,sVar5,pfVar8,pfVar7);
                          }
                          else {
                            View<float,_false,_std::allocator<unsigned_long>_>::begin
                                      ((iterator *)
                                       &itW.coordinates_.
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                       (View<float,_false,_std::allocator<unsigned_long>_> *)w_local
                                      );
                            View<float,_true,_std::allocator<unsigned_long>_>::begin
                                      ((const_iterator *)local_168,
                                       (View<float,_true,_std::allocator<unsigned_long>_> *)j);
                            while (bVar4 = Iterator<float,_false,_std::allocator<unsigned_long>_>::
                                           hasMore((
                                                  Iterator<float,_false,_std::allocator<unsigned_long>_>
                                                  *)&itW.coordinates_.
                                                                                                          
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ), bVar4) {
                              bVar4 = Iterator<float,_true,_std::allocator<unsigned_long>_>::hasMore
                                                ((Iterator<float,_true,_std::allocator<unsigned_long>_>
                                                  *)local_168);
                              Assert<bool>(bVar4);
                              pfVar9 = Iterator<float,_false,_std::allocator<unsigned_long>_>::
                                       operator*((Iterator<float,_false,_std::allocator<unsigned_long>_>
                                                  *)&itW.coordinates_.
                                                                                                          
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                );
                              y = Iterator<float,_true,_std::allocator<unsigned_long>_>::operator*
                                            ((Iterator<float,_true,_std::allocator<unsigned_long>_>
                                              *)local_168);
                              DividedByEqual<float,_float>::operator()
                                        ((DividedByEqual<float,_float> *)((long)&v_local + 7),pfVar9
                                         ,y);
                              Iterator<float,_false,_std::allocator<unsigned_long>_>::operator++
                                        ((Iterator<float,_false,_std::allocator<unsigned_long>_> *)
                                         &itW.coordinates_.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
                              Iterator<float,_true,_std::allocator<unsigned_long>_>::operator++
                                        ((Iterator<float,_true,_std::allocator<unsigned_long>_> *)
                                         local_168);
                            }
                            bVar4 = Iterator<float,_true,_std::allocator<unsigned_long>_>::hasMore
                                              ((Iterator<float,_true,_std::allocator<unsigned_long>_>
                                                *)local_168);
                            Assert<bool>((bool)(~bVar4 & 1));
                            Iterator<float,_true,_std::allocator<unsigned_long>_>::~Iterator
                                      ((Iterator<float,_true,_std::allocator<unsigned_long>_> *)
                                       local_168);
                            Iterator<float,_false,_std::allocator<unsigned_long>_>::~Iterator
                                      ((Iterator<float,_false,_std::allocator<unsigned_long>_> *)
                                       &itW.coordinates_.
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

inline void 
operate
(
    View<T1, false, A>& v, 
    const View<T2, isConst, A>& w, 
    Functor f
)
{
    if(!MARRAY_NO_ARG_TEST) {
        Assert(v.size() != 0 && w.size() != 0);
        Assert(w.dimension() == 0 || v.dimension() == w.dimension());
        if(w.dimension() != 0) {
            for(std::size_t j=0; j<v.dimension(); ++j) {
                Assert(v.shape(j) == w.shape(j));
            }
        }
    }
    if(w.dimension() == 0) {
        T2 x = w(0);
        if(v.isSimple()) {
            T1* dataV = &v(0);
            for(std::size_t j=0; j<v.size(); ++j) {
                f(dataV[j], x);
            }
        }
        else if(v.dimension() == 1)
            OperateHelperBinaryScalar<1, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 2)
            OperateHelperBinaryScalar<2, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 3)
            OperateHelperBinaryScalar<3, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 4)
            OperateHelperBinaryScalar<4, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 5)
            OperateHelperBinaryScalar<5, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 6)
            OperateHelperBinaryScalar<6, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 7)
            OperateHelperBinaryScalar<7, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 8)
            OperateHelperBinaryScalar<8, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 9)
            OperateHelperBinaryScalar<9, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 10)
            OperateHelperBinaryScalar<10, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else {
            for(typename View<T1, false>::iterator it = v.begin(); it.hasMore(); ++it) {
                f(*it, x);
            }
        }
    }
    else {
        if(v.overlaps(w)) {
            Marray<T2> m = w; // temporary copy
            operate(v, m, f); // recursive call
        }
        else {
            if(v.coordinateOrder() == w.coordinateOrder() 
                && v.isSimple() && w.isSimple()) {
                T1* dataV = &v(0);
                const T2* dataW = &w(0);
                for(std::size_t j=0; j<v.size(); ++j) {
                    f(dataV[j], dataW[j]);
                }
            }
            else if(v.dimension() == 1)
                OperateHelperBinary<1, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 2)
                OperateHelperBinary<2, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 3)
                OperateHelperBinary<3, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 4)
                OperateHelperBinary<4, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 5)
                OperateHelperBinary<5, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 6)
                OperateHelperBinary<6, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 7)
                OperateHelperBinary<7, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 8)
                OperateHelperBinary<8, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 9)
                OperateHelperBinary<9, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 10)
                OperateHelperBinary<10, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else {
                typename View<T1, false>::iterator itV = v.begin();
                typename View<T2, isConst>::const_iterator itW = w.begin();
                for(; itV.hasMore(); ++itV, ++itW) {
                    Assert(MARRAY_NO_DEBUG || itW.hasMore());
                    f(*itV, *itW);
                }
                Assert(MARRAY_NO_DEBUG || !itW.hasMore());
            }
        }
    }
}